

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv__udp_bind(uv_udp_t *handle,sockaddr *addr,uint addrlen,uint flags)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  int *piVar4;
  int __level;
  int iVar5;
  int yes;
  undefined8 local_38;
  
  if ((flags & 0xffffffda) != 0) {
    return -0x16;
  }
  if (((flags & 1) != 0) && (addr->sa_family != 10)) {
    return -0x16;
  }
  iVar2 = (handle->io_watcher).fd;
  local_38 = in_RAX;
  if (iVar2 == -1) {
    iVar2 = uv__socket((uint)addr->sa_family,2,0);
    if (iVar2 < 0) {
      return iVar2;
    }
    (handle->io_watcher).fd = iVar2;
  }
  if (flags < 0x20) goto LAB_0011cf97;
  iVar5 = 0;
  local_38 = CONCAT44(local_38._4_4_,1);
  if (addr->sa_family == 10) {
    __level = 0x29;
    iVar3 = 0x19;
LAB_0011cf74:
    iVar5 = 0;
    iVar3 = setsockopt(iVar2,__level,iVar3,&local_38,4);
    if (iVar3 != 0) {
      piVar4 = __errno_location();
      iVar5 = -*piVar4;
    }
  }
  else if (addr->sa_family == 2) {
    __level = 0;
    iVar3 = 0xb;
    goto LAB_0011cf74;
  }
  if (iVar5 != 0) {
    return iVar5;
  }
LAB_0011cf97:
  if (((flags & 4) == 0) || (iVar5 = uv__set_reuse(iVar2), iVar5 == 0)) {
    if ((flags & 1) != 0) {
      local_38 = CONCAT44(1,(undefined4)local_38);
      iVar5 = setsockopt(iVar2,0x29,0x1a,(void *)((long)&local_38 + 4),4);
      if (iVar5 == -1) {
        piVar4 = __errno_location();
        return -*piVar4;
      }
    }
    iVar2 = bind(iVar2,(sockaddr *)addr,addrlen);
    if (iVar2 == 0) {
      if (addr->sa_family == 10) {
        pbVar1 = (byte *)((long)&handle->flags + 2);
        *pbVar1 = *pbVar1 | 0x40;
      }
      pbVar1 = (byte *)((long)&handle->flags + 1);
      *pbVar1 = *pbVar1 | 0x20;
      iVar5 = 0;
    }
    else {
      piVar4 = __errno_location();
      iVar5 = -0x16;
      if (*piVar4 != 0x61) {
        iVar5 = -*piVar4;
      }
    }
  }
  return iVar5;
}

Assistant:

int uv__udp_bind(uv_udp_t* handle,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 unsigned int flags) {
  int err;
  int yes;
  int fd;

  /* Check for bad flags. */
  if (flags & ~(UV_UDP_IPV6ONLY | UV_UDP_REUSEADDR | UV_UDP_LINUX_RECVERR))
    return UV_EINVAL;

  /* Cannot set IPv6-only mode on non-IPv6 socket. */
  if ((flags & UV_UDP_IPV6ONLY) && addr->sa_family != AF_INET6)
    return UV_EINVAL;

  fd = handle->io_watcher.fd;
  if (fd == -1) {
    err = uv__socket(addr->sa_family, SOCK_DGRAM, 0);
    if (err < 0)
      return err;
    fd = err;
    handle->io_watcher.fd = fd;
  }

  if (flags & UV_UDP_LINUX_RECVERR) {
    err = uv__set_recverr(fd, addr->sa_family);
    if (err)
      return err;
  }

  if (flags & UV_UDP_REUSEADDR) {
    err = uv__set_reuse(fd);
    if (err)
      return err;
  }

  if (flags & UV_UDP_IPV6ONLY) {
#ifdef IPV6_V6ONLY
    yes = 1;
    if (setsockopt(fd, IPPROTO_IPV6, IPV6_V6ONLY, &yes, sizeof yes) == -1) {
      err = UV__ERR(errno);
      return err;
    }
#else
    err = UV_ENOTSUP;
    return err;
#endif
  }

  if (bind(fd, addr, addrlen)) {
    err = UV__ERR(errno);
    if (errno == EAFNOSUPPORT)
      /* OSX, other BSDs and SunoS fail with EAFNOSUPPORT when binding a
       * socket created with AF_INET to an AF_INET6 address or vice versa. */
      err = UV_EINVAL;
    return err;
  }

  if (addr->sa_family == AF_INET6)
    handle->flags |= UV_HANDLE_IPV6;

  handle->flags |= UV_HANDLE_BOUND;
  return 0;
}